

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

size_t __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::store
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this,ostream *_ostr,bool _swap)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  StatusInfo *in_RSI;
  long *in_RDI;
  size_t i;
  size_t bytes;
  vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
  *in_stack_ffffffffffffffb8;
  StatusInfo *_v;
  ostream *in_stack_ffffffffffffffc0;
  ostream *_os;
  ostream *local_30;
  size_t local_28;
  size_t local_8;
  
  bVar1 = IO::
          is_streamable<std::vector<OpenMesh::Attributes::StatusInfo,std::allocator<OpenMesh::Attributes::StatusInfo>>>
                    ();
  if (bVar1) {
    local_8 = IO::
              store<std::vector<OpenMesh::Attributes::StatusInfo,std::allocator<OpenMesh::Attributes::StatusInfo>>>
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,false);
  }
  else {
    local_28 = 0;
    local_30 = (ostream *)0x0;
    while( true ) {
      _os = local_30;
      poVar2 = (ostream *)(**(code **)(*in_RDI + 0x58))();
      if (poVar2 <= _os) break;
      _v = in_RSI;
      std::
      vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>::
      operator[]((vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
                  *)(in_RDI + 6),(size_type)local_30);
      sVar3 = IO::store<OpenMesh::Attributes::StatusInfo>(_os,_v,false);
      local_28 = sVar3 + local_28;
      local_30 = local_30 + 1;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }